

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

char * jsonnet_evaluate_file_aux(JsonnetVm *vm,char *filename,int *error,EvalKind kind)

{
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  JsonnetVm *vm_00;
  undefined8 in_R9;
  string input;
  ifstream f;
  undefined1 local_3d8 [32];
  ostream *local_3b8;
  _Base_ptr local_3b0;
  ostream local_3a8;
  undefined7 uStack_3a7;
  ios_base local_338 [264];
  long local_230 [4];
  int aiStack_210 [50];
  undefined8 auStack_148 [36];
  
  std::ifstream::ifstream(local_230);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0) {
    local_3b0 = (_Base_ptr)0x0;
    local_3a8 = (ostream)0x0;
    local_3d8._0_8_ = (undefined1 *)0x0;
    local_3d8._8_4_ = 0xffffffff;
    local_3b8 = &local_3a8;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_3b8,&local_3a8,&local_3a8,
               *(undefined8 *)((long)auStack_148 + *(long *)(local_230[0] + -0x18)),0xffffffff,in_R9
               ,0,0xffffffff);
    pcVar5 = jsonnet_evaluate_snippet_aux(vm,filename,(char *)local_3b8,error,kind);
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_3a8,"Opening input file: ",0x14);
    iVar1 = (int)&local_3a8;
    if (filename == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(CONCAT71(uStack_3a7,local_3a8) + -0x18));
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(&local_3a8,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_3a8,": ",2);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(CONCAT71(uStack_3a7,local_3a8) + -0x18));
    }
    else {
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(&local_3a8,pcVar5,sVar3);
    }
    *error = 1;
    vm_00 = (JsonnetVm *)local_3d8;
    std::__cxx11::stringbuf::str();
    pcVar5 = jsonnet_realloc(vm_00,(char *)0x0,CONCAT44(local_3d8._12_4_,local_3d8._8_4_) + 1);
    uVar2 = local_3d8._0_8_;
    memcpy(pcVar5,(void *)local_3d8._0_8_,CONCAT44(local_3d8._12_4_,local_3d8._8_4_) + 1);
    if ((undefined1 *)uVar2 != local_3d8 + 0x10) {
      operator_delete((void *)uVar2,local_3d8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_3b8);
    std::ios_base::~ios_base(local_338);
  }
  std::ifstream::~ifstream(local_230);
  return pcVar5;
}

Assistant:

static char *jsonnet_evaluate_file_aux(JsonnetVm *vm, const char *filename, int *error,
                                       EvalKind kind)
{
    std::ifstream f;
    f.open(filename);
    if (!f.good()) {
        std::stringstream ss;
        ss << "Opening input file: " << filename << ": " << strerror(errno);
        *error = true;
        return from_string(vm, ss.str());
    }
    std::string input;
    input.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());

    return jsonnet_evaluate_snippet_aux(vm, filename, input.c_str(), error, kind);
}